

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O2

void __thiscall CVmRuntimeSymbols::~CVmRuntimeSymbols(CVmRuntimeSymbols *this)

{
  vm_runtime_sym *pvVar1;
  vm_runtime_sym *__ptr;
  
  __ptr = this->head_;
  while (__ptr != (vm_runtime_sym *)0x0) {
    pvVar1 = __ptr->nxt;
    free(__ptr);
    __ptr = pvVar1;
  }
  return;
}

Assistant:

CVmRuntimeSymbols::~CVmRuntimeSymbols()
{
    vm_runtime_sym *sym;
    vm_runtime_sym *nxt;
    
    /* delete each symbol */
    for (sym = head_ ; sym != 0 ; sym = nxt)
    {
        /* 
         *   remember the next one, since we're deleting our link pointer
         *   along with the structure 
         */
        nxt = sym->nxt;

        /* delete it */
        t3free(sym);
    }
}